

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

wstring * PDA::Transducer::Generator::comment(wstring *__return_storage_ptr__,wstring *source)

{
  wstring *pwVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  long *local_38 [2];
  long local_28 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::operator+(&local_58,L"\t#***\t",source);
  pwVar1 = (wstring *)std::__cxx11::wstring::append((wchar_t *)&local_58);
  std::__cxx11::wstring::wstring((wstring *)local_38,pwVar1);
  std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::comment(const std::wstring &source)
{
    std::wstring result;
    result = L"\t#***\t" + source + L"\t***#";
    return result;
}